

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O1

int __thiscall cs_impl::string_cs_ext::toupper(string_cs_ext *this,int __c)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined4 in_register_00000034;
  string s;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  local_48 = 0;
  local_40 = 0;
  lVar1 = ((long *)CONCAT44(in_register_00000034,__c))[1];
  local_50 = &local_40;
  if (lVar1 != 0) {
    lVar2 = *(long *)CONCAT44(in_register_00000034,__c);
    lVar3 = 0;
    do {
      ::toupper((int)*(char *)(lVar2 + lVar3));
      std::__cxx11::string::push_back((char)&local_50);
      lVar3 = lVar3 + 1;
    } while (lVar1 != lVar3);
  }
  *(string_cs_ext **)this = this + 0x10;
  if (local_50 == &local_40) {
    *(ulong *)(this + 0x10) = CONCAT71(uStack_3f,local_40);
    *(undefined8 *)(this + 0x18) = uStack_38;
  }
  else {
    *(undefined1 **)this = local_50;
    *(ulong *)(this + 0x10) = CONCAT71(uStack_3f,local_40);
  }
  *(undefined8 *)(this + 8) = local_48;
  return (int)this;
}

Assistant:

string toupper(const string &str)
		{
			string s;
			for (auto &ch: str)
				s.push_back(std::toupper(ch));
			return std::move(s);
		}